

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

int WebRtcIsac_DecodeFrameLen(Bitstr *streamdata,int16_t *framesamples)

{
  int local_28;
  int local_24;
  int err;
  int frame_mode;
  int16_t *framesamples_local;
  Bitstr *streamdata_local;
  
  _err = framesamples;
  framesamples_local = (int16_t *)streamdata;
  local_28 = WebRtcIsac_DecHistOneStepMulti
                       (&local_24,streamdata,WebRtcIsac_kFrameLengthCdf_ptr,
                        WebRtcIsac_kFrameLengthInitIndex,1);
  if (local_28 < 0) {
    streamdata_local._4_4_ = -0x19f0;
  }
  else {
    if (local_24 == 1) {
      *_err = 0x1e0;
    }
    else if (local_24 == 2) {
      *_err = 0x3c0;
    }
    else {
      local_28 = -0x19e6;
    }
    streamdata_local._4_4_ = local_28;
  }
  return streamdata_local._4_4_;
}

Assistant:

int WebRtcIsac_DecodeFrameLen(Bitstr* streamdata, int16_t* framesamples) {
  int frame_mode, err;
  err = 0;
  /* entropy decoding of frame length [1:30ms,2:60ms] */
  err = WebRtcIsac_DecHistOneStepMulti(&frame_mode, streamdata,
                                       WebRtcIsac_kFrameLengthCdf_ptr,
                                       WebRtcIsac_kFrameLengthInitIndex, 1);
  if (err < 0)
    return -ISAC_RANGE_ERROR_DECODE_FRAME_LENGTH;

  switch (frame_mode) {
    case 1:
      *framesamples = 480; /* 30ms */
      break;
    case 2:
      *framesamples = 960; /* 60ms */
      break;
    default:
      err = -ISAC_DISALLOWED_FRAME_MODE_DECODER;
  }
  return err;
}